

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quass.cpp
# Opt level: O2

void loginformation(Runtime *rt,Basis *basis,CholeskyFactor *factor,HighsTimer *timer)

{
  Statistics *pSVar1;
  size_t __nbytes;
  void *__buf;
  SumNum SVar2;
  double local_48;
  HighsInt local_40 [2];
  double local_38;
  
  std::vector<int,_std::allocator<int>_>::push_back
            (&rt->statistics->iteration,&rt->statistics->num_iterations);
  __nbytes = (ulong)((long)(basis->active_constraint_index).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(basis->active_constraint_index).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  local_48 = (double)CONCAT44(local_48._4_4_,(rt->instance).num_var - (int)__nbytes);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&rt->statistics->nullspacedimension,(int *)&local_48);
  pSVar1 = rt->statistics;
  local_48 = Instance::objval(&rt->instance,&rt->primal);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&pSVar1->objval,&local_48);
  pSVar1 = rt->statistics;
  HighsTimer::read(timer,0,__buf,__nbytes);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&pSVar1->time,&local_48);
  SVar2 = Instance::sumnumprimalinfeasibilities(&rt->instance,&rt->primal,&rt->rowactivity);
  local_48 = SVar2.sum;
  local_40[0] = SVar2.num;
  std::vector<double,_std::allocator<double>_>::push_back
            (&rt->statistics->sum_primal_infeasibilities,&local_48);
  std::vector<int,_std::allocator<int>_>::push_back
            (&rt->statistics->num_primal_infeasibilities,local_40);
  pSVar1 = rt->statistics;
  local_38 = CholeskyFactor::density(factor);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&pSVar1->density_factor,&local_38);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&rt->statistics->density_nullspace,&local_38);
  return;
}

Assistant:

static void loginformation(Runtime& rt, Basis& basis, CholeskyFactor& factor,
                           HighsTimer& timer) {
  rt.statistics.iteration.push_back(rt.statistics.num_iterations);
  rt.statistics.nullspacedimension.push_back(rt.instance.num_var -
                                             basis.getnumactive());
  rt.statistics.objval.push_back(rt.instance.objval(rt.primal));
  rt.statistics.time.push_back(timer.read());
  SumNum sm =
      rt.instance.sumnumprimalinfeasibilities(rt.primal, rt.rowactivity);
  rt.statistics.sum_primal_infeasibilities.push_back(sm.sum);
  rt.statistics.num_primal_infeasibilities.push_back(sm.num);
  rt.statistics.density_factor.push_back(factor.density());
  rt.statistics.density_nullspace.push_back(0.0);
}